

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int vdbeSorterListToPMA(SortSubtask *pTask,SorterList *pList)

{
  sqlite3 *db_00;
  SorterRecord *pSVar1;
  SorterRecord *pNext;
  SorterRecord *p;
  PmaWriter writer;
  int rc;
  sqlite3 *db;
  SorterList *pList_local;
  SortSubtask *pTask_local;
  
  db_00 = pTask->pSorter->db;
  writer.pFd._4_4_ = 0;
  memset(&p,0,0x30);
  if ((pTask->file).pFd == (sqlite3_file *)0x0) {
    writer.pFd._4_4_ = vdbeSorterOpenTempFile(db_00,0,&(pTask->file).pFd);
  }
  if (writer.pFd._4_4_ == 0) {
    vdbeSorterExtendFile(db_00,(pTask->file).pFd,(pTask->file).iEof + (long)pList->szPMA + 9);
  }
  if (writer.pFd._4_4_ == 0) {
    writer.pFd._4_4_ = vdbeSorterSort(pTask,pList);
  }
  if (writer.pFd._4_4_ == 0) {
    vdbePmaWriterInit((pTask->file).pFd,(PmaWriter *)&p,pTask->pSorter->pgsz,(pTask->file).iEof);
    pTask->nPMA = pTask->nPMA + 1;
    vdbePmaWriteVarint((PmaWriter *)&p,(long)pList->szPMA);
    pSVar1 = pList->pList;
    while (pNext = pSVar1, pNext != (SorterRecord *)0x0) {
      pSVar1 = (pNext->u).pNext;
      vdbePmaWriteVarint((PmaWriter *)&p,(long)pNext->nVal);
      vdbePmaWriteBlob((PmaWriter *)&p,(u8 *)(pNext + 1),pNext->nVal);
      if (pList->aMemory == (u8 *)0x0) {
        sqlite3_free(pNext);
      }
    }
    pList->pList = (SorterRecord *)0x0;
    writer.pFd._4_4_ = vdbePmaWriterFinish((PmaWriter *)&p,&(pTask->file).iEof);
  }
  return writer.pFd._4_4_;
}

Assistant:

static int vdbeSorterListToPMA(SortSubtask *pTask, SorterList *pList){
  sqlite3 *db = pTask->pSorter->db;
  int rc = SQLITE_OK;             /* Return code */
  PmaWriter writer;               /* Object used to write to the file */

#ifdef SQLITE_DEBUG
  /* Set iSz to the expected size of file pTask->file after writing the PMA.
  ** This is used by an assert() statement at the end of this function.  */
  i64 iSz = pList->szPMA + sqlite3VarintLen(pList->szPMA) + pTask->file.iEof;
#endif

  vdbeSorterWorkDebug(pTask, "enter");
  memset(&writer, 0, sizeof(PmaWriter));
  assert( pList->szPMA>0 );

  /* If the first temporary PMA file has not been opened, open it now. */
  if( pTask->file.pFd==0 ){
    rc = vdbeSorterOpenTempFile(db, 0, &pTask->file.pFd);
    assert( rc!=SQLITE_OK || pTask->file.pFd );
    assert( pTask->file.iEof==0 );
    assert( pTask->nPMA==0 );
  }

  /* Try to get the file to memory map */
  if( rc==SQLITE_OK ){
    vdbeSorterExtendFile(db, pTask->file.pFd, pTask->file.iEof+pList->szPMA+9);
  }

  /* Sort the list */
  if( rc==SQLITE_OK ){
    rc = vdbeSorterSort(pTask, pList);
  }

  if( rc==SQLITE_OK ){
    SorterRecord *p;
    SorterRecord *pNext = 0;

    vdbePmaWriterInit(pTask->file.pFd, &writer, pTask->pSorter->pgsz,
                      pTask->file.iEof);
    pTask->nPMA++;
    vdbePmaWriteVarint(&writer, pList->szPMA);
    for(p=pList->pList; p; p=pNext){
      pNext = p->u.pNext;
      vdbePmaWriteVarint(&writer, p->nVal);
      vdbePmaWriteBlob(&writer, SRVAL(p), p->nVal);
      if( pList->aMemory==0 ) sqlite3_free(p);
    }
    pList->pList = p;
    rc = vdbePmaWriterFinish(&writer, &pTask->file.iEof);
  }

  vdbeSorterWorkDebug(pTask, "exit");
  assert( rc!=SQLITE_OK || pList->pList==0 );
  assert( rc!=SQLITE_OK || pTask->file.iEof==iSz );
  return rc;
}